

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ManSetMapRefsGate(Nf_Man_t *p,int iObj,int Required,Nf_Mat_t *pM)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Mio_Cell2_t *pMVar4;
  int *piVar5;
  int *piVar6;
  int *pCut;
  Mio_Cell2_t *pCell;
  int local_28;
  int fCompl;
  int iVar;
  int k;
  Nf_Mat_t *pM_local;
  int Required_local;
  int iObj_local;
  Nf_Man_t *p_local;
  
  pMVar4 = Nf_ManCell(p,*(uint *)pM & 0xfffff);
  piVar5 = Nf_ObjCutSet(p,iObj);
  piVar5 = Nf_CutFromHandle(piVar5,*(uint *)pM >> 0x14 & 0x3ff);
  fCompl = 0;
  while( true ) {
    iVar2 = Nf_CutSize(piVar5);
    bVar1 = false;
    if (fCompl < iVar2) {
      piVar6 = Nf_CutLeaves(piVar5);
      iVar2 = Nf_CfgVar(pM->Cfg,fCompl);
      local_28 = piVar6[iVar2];
      bVar1 = false;
      if (local_28 != 0) {
        pCell._4_4_ = Nf_CfgCompl(pM->Cfg,fCompl);
        bVar1 = true;
      }
    }
    if (!bVar1) break;
    Nf_ObjMapRefInc(p,local_28,pCell._4_4_);
    Nf_ObjUpdateRequired(p,local_28,pCell._4_4_,Required - pMVar4->iDelays[fCompl]);
    fCompl = fCompl + 1;
  }
  uVar3 = Nf_CutSize(piVar5);
  if (uVar3 == *(uint *)&pMVar4->field_0x10 >> 0x1c) {
    p->pPars->MapAreaF = pMVar4->AreaF + p->pPars->MapAreaF;
    iVar2 = Nf_CutSize(piVar5);
    p->pPars->Edge = (long)iVar2 + p->pPars->Edge;
    p->pPars->Area = p->pPars->Area + 1;
    if (-1 < *(int *)pM) {
      *(uint *)pM = *(uint *)pM & 0x7fffffff | 0x80000000;
      return;
    }
    __assert_fail("pM->fBest == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x5d4,"void Nf_ManSetMapRefsGate(Nf_Man_t *, int, int, Nf_Mat_t *)");
  }
  __assert_fail("Nf_CutSize(pCut) == (int)pCell->nFanins",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                ,0x5ce,"void Nf_ManSetMapRefsGate(Nf_Man_t *, int, int, Nf_Mat_t *)");
}

Assistant:

void Nf_ManSetMapRefsGate( Nf_Man_t * p, int iObj, int Required, Nf_Mat_t * pM )
{
    int k, iVar, fCompl;
    Mio_Cell2_t * pCell = Nf_ManCell( p, pM->Gate );
    int * pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, iObj), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        Nf_ObjMapRefInc( p, iVar, fCompl );
        Nf_ObjUpdateRequired( p, iVar, fCompl, Required - pCell->iDelays[k] );
    }
    assert( Nf_CutSize(pCut) == (int)pCell->nFanins );
    // update global stats
    p->pPars->MapAreaF += pCell->AreaF;
    p->pPars->Edge += Nf_CutSize(pCut);
    p->pPars->Area++;
    // update status of the gate
    assert( pM->fBest == 0 );
    pM->fBest = 1;
}